

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O1

void init_destination(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  JOCTET *pJVar2;
  
  pjVar1 = cinfo->dest;
  pJVar2 = (JOCTET *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1000);
  pjVar1[1].free_in_buffer = (size_t)pJVar2;
  pjVar1->next_output_byte = pJVar2;
  pjVar1->free_in_buffer = 0x1000;
  return;
}

Assistant:

METHODDEF(void)
init_destination (j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr) cinfo->dest;

  /* Allocate the output buffer --- it will be released when done with image */
  dest->buffer = (JOCTET *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  OUTPUT_BUF_SIZE * SIZEOF(JOCTET));

  dest->pub.next_output_byte = dest->buffer;
  dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;
}